

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JP2K.cpp
# Opt level: O3

void __thiscall ASDCP::JP2K::Accessor::COM::Dump(COM *this,FILE *stream)

{
  string tmp_str;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  if (*this == (COM)0x1) {
    local_30 = 0;
    local_28 = 0;
    local_38 = &local_28;
    std::__cxx11::string::_M_replace((ulong)&local_38,0,(char *)0x0,*(ulong *)(this + 8));
    fprintf((FILE *)stream,"COM:%s\n",local_38);
    if (local_38 != &local_28) {
      operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
    }
    return;
  }
  fwrite("COM:\n",5,1,(FILE *)stream);
  Kumu::hexdump(*(uchar **)(this + 8),*(uint *)(this + 0x10),(_IO_FILE *)stream);
  return;
}

Assistant:

void
ASDCP::JP2K::Accessor::COM::Dump(FILE* stream) const
{
  if ( stream == 0 )
    stream = stderr;

  if ( IsText() )
    {
      std::string tmp_str;
      tmp_str.assign((char*)CommentData(), CommentSize());
      fprintf(stream, "COM:%s\n", tmp_str.c_str());
    }
  else
    {
      fprintf(stream, "COM:\n");
      Kumu::hexdump(CommentData(), CommentSize(), stream);
    }
}